

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

void __thiscall QToolBoxPrivate::_q_buttonClicked(QToolBoxPrivate *this)

{
  QToolBox *this_00;
  Page *pPVar1;
  QToolBoxButton *pQVar2;
  int index;
  pointer puVar3;
  QWidget *widget;
  
  this_00 = *(QToolBox **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QObject::sender();
  pQVar2 = (QToolBoxButton *)QMetaObject::cast((QObject *)&QToolBoxButton::staticMetaObject);
  puVar3 = (this->pageList).
           super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  widget = (QWidget *)0x0;
  do {
    if (puVar3 == (this->pageList).
                  super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_004b8557:
      index = QToolBox::indexOf(this_00,widget);
      QToolBox::setCurrentIndex(this_00,index);
      return;
    }
    pPVar1 = (puVar3->_M_t).
             super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
             ._M_t.
             super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
             .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
    if (pPVar1->button == pQVar2) {
      widget = pPVar1->widget;
      goto LAB_004b8557;
    }
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

void QToolBoxPrivate::_q_buttonClicked()
{
    Q_Q(QToolBox);
    QToolBoxButton *tb = qobject_cast<QToolBoxButton*>(q->sender());
    QWidget* item = nullptr;
    for (const auto &page : pageList) {
        if (page->button == tb) {
            item = page->widget;
            break;
        }
    }

    q->setCurrentIndex(q->indexOf(item));
}